

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

void __thiscall wabt::interp::Module::Module(Module *this,Store *param_1,ModuleDesc *desc)

{
  ImportType *pIVar1;
  pointer pEVar2;
  ImportDesc *import;
  ImportType *__args;
  pointer __args_00;
  
  (this->super_Object).kind_ = Module;
  *(undefined8 *)&(this->super_Object).finalizer_.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->super_Object).finalizer_.super__Function_base._M_functor + 8) = 0;
  (this->super_Object).finalizer_.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->super_Object).finalizer_._M_invoker = (_Invoker_type)0x0;
  (this->super_Object).host_info_ = (void *)0x0;
  (this->super_Object).self_.index = 0;
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__Module_0024b1a0;
  (this->desc_).func_types.
  super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>._M_impl.
  super__Vector_impl_data._M_start =
       (desc->func_types).
       super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->desc_).func_types.
  super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (desc->func_types).
       super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->desc_).func_types.
  super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (desc->func_types).
       super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (desc->func_types).
  super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (desc->func_types).
  super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (desc->func_types).
  super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->desc_).imports.
  super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>._M_impl.
  super__Vector_impl_data._M_start =
       (desc->imports).
       super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->desc_).imports.
  super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (desc->imports).
       super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (this->desc_).imports.
  super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (desc->imports).
       super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (desc->imports).
  super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (desc->imports).
  super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (desc->imports).
  super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->desc_).funcs.
  super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>._M_impl.
  super__Vector_impl_data._M_start =
       (desc->funcs).
       super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->desc_).funcs.
  super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (desc->funcs).
       super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->desc_).funcs.
  super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (desc->funcs).
       super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (desc->funcs).super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (desc->funcs).super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (desc->funcs).super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->desc_).tables.
  super__Vector_base<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>._M_impl.
  super__Vector_impl_data._M_start =
       (desc->tables).
       super__Vector_base<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>._M_impl
       .super__Vector_impl_data._M_start;
  (this->desc_).tables.
  super__Vector_base<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (desc->tables).
       super__Vector_base<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>._M_impl
       .super__Vector_impl_data._M_finish;
  (this->desc_).tables.
  super__Vector_base<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (desc->tables).
       super__Vector_base<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage;
  (desc->tables).
  super__Vector_base<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (desc->tables).
  super__Vector_base<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (desc->tables).
  super__Vector_base<wabt::interp::TableDesc,_std::allocator<wabt::interp::TableDesc>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->desc_).memories.
  super__Vector_base<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>._M_impl.
  super__Vector_impl_data._M_start =
       (desc->memories).
       super__Vector_base<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->desc_).memories.
  super__Vector_base<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (desc->memories).
       super__Vector_base<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (this->desc_).memories.
  super__Vector_base<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (desc->memories).
       super__Vector_base<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (desc->memories).
  super__Vector_base<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (desc->memories).
  super__Vector_base<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (desc->memories).
  super__Vector_base<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->desc_).globals.
  super__Vector_base<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>._M_impl.
  super__Vector_impl_data._M_start =
       (desc->globals).
       super__Vector_base<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->desc_).globals.
  super__Vector_base<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (desc->globals).
       super__Vector_base<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (this->desc_).globals.
  super__Vector_base<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (desc->globals).
       super__Vector_base<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (desc->globals).
  super__Vector_base<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (desc->globals).
  super__Vector_base<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (desc->globals).
  super__Vector_base<wabt::interp::GlobalDesc,_std::allocator<wabt::interp::GlobalDesc>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->desc_).tags.
  super__Vector_base<wabt::interp::TagDesc,_std::allocator<wabt::interp::TagDesc>_>._M_impl.
  super__Vector_impl_data._M_start =
       (desc->tags).
       super__Vector_base<wabt::interp::TagDesc,_std::allocator<wabt::interp::TagDesc>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->desc_).tags.
  super__Vector_base<wabt::interp::TagDesc,_std::allocator<wabt::interp::TagDesc>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (desc->tags).
       super__Vector_base<wabt::interp::TagDesc,_std::allocator<wabt::interp::TagDesc>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->desc_).tags.
  super__Vector_base<wabt::interp::TagDesc,_std::allocator<wabt::interp::TagDesc>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (desc->tags).
       super__Vector_base<wabt::interp::TagDesc,_std::allocator<wabt::interp::TagDesc>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (desc->tags).super__Vector_base<wabt::interp::TagDesc,_std::allocator<wabt::interp::TagDesc>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (desc->tags).super__Vector_base<wabt::interp::TagDesc,_std::allocator<wabt::interp::TagDesc>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (desc->tags).super__Vector_base<wabt::interp::TagDesc,_std::allocator<wabt::interp::TagDesc>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->desc_).exports.
  super__Vector_base<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>._M_impl.
  super__Vector_impl_data._M_start =
       (desc->exports).
       super__Vector_base<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->desc_).exports.
  super__Vector_base<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (desc->exports).
       super__Vector_base<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (this->desc_).exports.
  super__Vector_base<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (desc->exports).
       super__Vector_base<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (desc->exports).
  super__Vector_base<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (desc->exports).
  super__Vector_base<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (desc->exports).
  super__Vector_base<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->desc_).starts.
  super__Vector_base<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>._M_impl.
  super__Vector_impl_data._M_start =
       (desc->starts).
       super__Vector_base<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>._M_impl
       .super__Vector_impl_data._M_start;
  (this->desc_).starts.
  super__Vector_base<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (desc->starts).
       super__Vector_base<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>._M_impl
       .super__Vector_impl_data._M_finish;
  (this->desc_).starts.
  super__Vector_base<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (desc->starts).
       super__Vector_base<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage;
  (desc->starts).
  super__Vector_base<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (desc->starts).
  super__Vector_base<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (desc->starts).
  super__Vector_base<wabt::interp::StartDesc,_std::allocator<wabt::interp::StartDesc>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->desc_).elems.
  super__Vector_base<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>._M_impl.
  super__Vector_impl_data._M_start =
       (desc->elems).
       super__Vector_base<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->desc_).elems.
  super__Vector_base<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (desc->elems).
       super__Vector_base<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->desc_).elems.
  super__Vector_base<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (desc->elems).
       super__Vector_base<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (desc->elems).super__Vector_base<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (desc->elems).super__Vector_base<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (desc->elems).super__Vector_base<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->desc_).datas.
  super__Vector_base<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>._M_impl.
  super__Vector_impl_data._M_start =
       (desc->datas).
       super__Vector_base<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->desc_).datas.
  super__Vector_base<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (desc->datas).
       super__Vector_base<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->desc_).datas.
  super__Vector_base<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (desc->datas).
       super__Vector_base<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (desc->datas).super__Vector_base<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (desc->datas).super__Vector_base<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (desc->datas).super__Vector_base<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->desc_).istream.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (desc->istream).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->desc_).istream.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (desc->istream).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (this->desc_).istream.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (desc->istream).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (desc->istream).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (desc->istream).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (desc->istream).data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->export_types_).
  super__Vector_base<wabt::interp::ExportType,_std::allocator<wabt::interp::ExportType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->export_types_).
  super__Vector_base<wabt::interp::ExportType,_std::allocator<wabt::interp::ExportType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->import_types_).
  super__Vector_base<wabt::interp::ImportType,_std::allocator<wabt::interp::ImportType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->export_types_).
  super__Vector_base<wabt::interp::ExportType,_std::allocator<wabt::interp::ExportType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->import_types_).
  super__Vector_base<wabt::interp::ImportType,_std::allocator<wabt::interp::ImportType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->import_types_).
  super__Vector_base<wabt::interp::ImportType,_std::allocator<wabt::interp::ImportType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  __args = &((this->desc_).imports.
             super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>
             ._M_impl.super__Vector_impl_data._M_start)->type;
  pIVar1 = &((this->desc_).imports.
             super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>
             ._M_impl.super__Vector_impl_data._M_finish)->type;
  if (__args != pIVar1) {
    do {
      std::vector<wabt::interp::ImportType,std::allocator<wabt::interp::ImportType>>::
      emplace_back<wabt::interp::ImportType&>
                ((vector<wabt::interp::ImportType,std::allocator<wabt::interp::ImportType>> *)
                 &this->import_types_,__args);
      __args = __args + 1;
    } while (__args != pIVar1);
  }
  __args_00 = (this->desc_).exports.
              super__Vector_base<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>
              ._M_impl.super__Vector_impl_data._M_start;
  pEVar2 = (this->desc_).exports.
           super__Vector_base<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (__args_00 != pEVar2) {
    do {
      std::vector<wabt::interp::ExportType,std::allocator<wabt::interp::ExportType>>::
      emplace_back<wabt::interp::ExportType&>
                ((vector<wabt::interp::ExportType,std::allocator<wabt::interp::ExportType>> *)
                 &this->export_types_,&__args_00->type);
      __args_00 = __args_00 + 1;
    } while (__args_00 != pEVar2);
  }
  return;
}

Assistant:

Module::Module(Store&, ModuleDesc desc)
    : Object(skind), desc_(std::move(desc)) {
  for (auto&& import : desc_.imports) {
    import_types_.emplace_back(import.type);
  }

  for (auto&& export_ : desc_.exports) {
    export_types_.emplace_back(export_.type);
  }
}